

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void raviV_op_vararg(lua_State *L,CallInfo *ci,LClosure *cl,int a,int b)

{
  ushort uVar1;
  long lVar2;
  StkId pTVar3;
  LuaType *pLVar4;
  StkId pTVar5;
  ulong uVar6;
  ulong uVar7;
  uint n;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  
  pTVar3 = (ci->u).l.base;
  uVar11 = ~(uint)cl->p->numparams + (int)((ulong)((long)pTVar3 - (long)ci->func) >> 4);
  n = ~((int)uVar11 >> 0x1f) & uVar11;
  if (b < 1) {
    if ((long)L->stack_last - (long)L->top >> 4 <= (long)(ulong)n) {
      luaD_growstack(L,n);
      pTVar3 = (ci->u).l.base;
    }
    pTVar5 = pTVar3 + a;
    L->top = pTVar5 + n;
    uVar8 = n;
  }
  else {
    pTVar5 = pTVar3 + a;
    uVar8 = b - 1;
  }
  if ((int)uVar8 < (int)uVar11) {
    uVar11 = uVar8;
  }
  uVar9 = (ulong)(~((int)uVar11 >> 0x1f) & uVar11);
  lVar10 = 8;
  uVar6 = 0;
  while( true ) {
    if (uVar9 == uVar6) {
      uVar7 = uVar6 & 0xffffffff;
      if ((int)uVar6 < (int)uVar8) {
        uVar7 = (ulong)uVar8;
      }
      lVar10 = uVar7 - uVar9;
      pLVar4 = &pTVar5[uVar9].tt_;
      while (bVar12 = lVar10 != 0, lVar10 = lVar10 + -1, bVar12) {
        *pLVar4 = 0;
        pLVar4 = pLVar4 + 8;
      }
      return;
    }
    lVar2 = *(long *)((long)pTVar3 + lVar10 + (ulong)n * -0x10 + -8);
    *(long *)((long)pTVar5 + lVar10 + -8) = lVar2;
    uVar1 = *(ushort *)((long)&pTVar3[-(ulong)n].value_ + lVar10);
    *(ushort *)((long)&pTVar5->value_ + lVar10) = uVar1;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)*(byte *)(lVar2 + 8) ||
        ((L != (lua_State *)0x0 && ((*(byte *)(lVar2 + 9) & (L->l_G->currentwhite ^ 0x18)) != 0)))))
       ) break;
    uVar6 = uVar6 + 1;
    lVar10 = lVar10 + 0x10;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0xb96,"void raviV_op_vararg(lua_State *, CallInfo *, LClosure *, int, int)");
}

Assistant:

void raviV_op_vararg(lua_State *L, CallInfo *ci, LClosure *cl, int a, int b) {
  StkId base = ci->u.l.base;
  StkId ra;
  int j;
  int n = cast_int(base - ci->func) - cl->p->numparams - 1;
  if (n < 0) /* less arguments than parameters? */
    n = 0;   /* no vararg arguments */
  b = b - 1;
  if (b < 0) { /* B == 0? */
    b = n;     /* get all var. arguments */
    Protect_base(luaD_checkstack(L, n));
    ra = base + a; /* previous call may change the stack */
    L->top = ra + n;
  }
  else {
    ra = base + a;
  }
  for (j = 0; j < b && j < n; j++) 
    setobjs2s(L, ra + j, base - n + j);
  for (; j < b; j++) /* complete required results with nil */
    setnilvalue(ra + j);
}